

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffsetstringarray_p.h
# Opt level: O0

View __thiscall
QOffsetStringArray<std::array<char,_73UL>,_std::array<unsigned_char,_13UL>_>::viewAt
          (QOffsetStringArray<std::array<char,_73UL>,_std::array<unsigned_char,_13UL>_> *this,
          qsizetype index)

{
  long lVar1;
  View VVar2;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::array<char,_73UL>::data((array<char,_73UL> *)0x23bd3f);
  std::array<unsigned_char,_13UL>::operator[]
            ((array<unsigned_char,_13UL> *)in_RDI,(size_type)in_stack_ffffffffffffffa8);
  std::array<unsigned_char,_13UL>::operator[]
            ((array<unsigned_char,_13UL> *)in_RDI,(size_type)in_stack_ffffffffffffffa8);
  std::array<unsigned_char,_13UL>::operator[]
            ((array<unsigned_char,_13UL> *)in_RDI,(size_type)in_stack_ffffffffffffffa8);
  QByteArrayView::QByteArrayView<char,_true>
            (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    VVar2.m_data = local_10;
    VVar2.m_size = local_18;
    return VVar2;
  }
  __stack_chk_fail();
}

Assistant:

constexpr View viewAt(qsizetype index) const noexcept
    {
        return { m_string.data() + m_offsets[index],
                    qsizetype(m_offsets[index + 1]) - qsizetype(m_offsets[index]) - 1 };
    }